

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QTextureData *this;
  uchar *puVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  undefined4 *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  double dVar6;
  double dVar7;
  qreal ty;
  qreal tx;
  qreal iw;
  uint *b;
  uint *end;
  qreal fw;
  qreal fy_1;
  qreal fx_1;
  qreal fdw;
  qreal fdy_1;
  qreal fdx_1;
  int i_1;
  int i;
  uchar *src;
  int fy;
  int fx;
  int fdy;
  int fdx;
  Fetch1PixelFunc fetch1;
  QPixelLayout *layout;
  bool useFetch;
  qreal cy;
  qreal cx;
  QTextureData *image;
  int py_2;
  int px_2;
  int py_1;
  int px_1;
  int px;
  int py;
  QSpanData *in_stack_ffffffffffffff28;
  qsizetype in_stack_ffffffffffffff30;
  qreal in_stack_ffffffffffffff38;
  undefined4 *puVar8;
  qreal in_stack_ffffffffffffff40;
  int local_90;
  int local_8c;
  int local_80;
  int local_7c;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QTextureData *)(in_RSI + 0xa8);
  dVar6 = (double)in_ECX + 0.5;
  dVar7 = (double)in_EDX + 0.5;
  bVar2 = canUseFastMatrixPath
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff28);
  if (bVar2) {
    iVar3 = (int)(*(double *)(in_RSI + 0x38) * 65536.0);
    iVar4 = (int)(*(double *)(in_RSI + 0x40) * 65536.0);
    local_7c = (int)((*(double *)(in_RSI + 0x50) * dVar7 + *(double *)(in_RSI + 0x38) * dVar6 +
                     *(double *)(in_RSI + 0x70)) * 65536.0);
    local_80 = (int)((*(double *)(in_RSI + 0x58) * dVar7 + *(double *)(in_RSI + 0x40) * dVar6 +
                     *(double *)(in_RSI + 0x78)) * 65536.0);
    if (iVar4 == 0) {
      local_c = local_80 >> 0x10;
      fetchTransformed_pixelBounds<(TextureBlendType)3>
                (*(int *)(in_RSI + 0xb4),*(int *)(in_RSI + 0xbc),*(int *)(in_RSI + 0xc4) + -1,
                 &local_c);
      puVar5 = QTextureData::scanLine(this,local_c);
      for (local_8c = 0; local_8c < in_R8D; local_8c = local_8c + 1) {
        local_10 = local_7c >> 0x10;
        fetchTransformed_pixelBounds<(TextureBlendType)3>
                  (*(int *)(in_RSI + 0xb0),*(int *)(in_RSI + 0xb8),*(int *)(in_RSI + 0xc0) + -1,
                   &local_10);
        in_RDI[local_8c] = *(undefined4 *)(puVar5 + (long)local_10 * 4);
        local_7c = iVar3 + local_7c;
      }
    }
    else {
      for (local_90 = 0; local_90 < in_R8D; local_90 = local_90 + 1) {
        local_14 = local_7c >> 0x10;
        local_18 = local_80 >> 0x10;
        fetchTransformed_pixelBounds<(TextureBlendType)3>
                  (*(int *)(in_RSI + 0xb0),*(int *)(in_RSI + 0xb8),*(int *)(in_RSI + 0xc0) + -1,
                   &local_14);
        fetchTransformed_pixelBounds<(TextureBlendType)3>
                  (*(int *)(in_RSI + 0xb4),*(int *)(in_RSI + 0xbc),*(int *)(in_RSI + 0xc4) + -1,
                   &local_18);
        puVar5 = QTextureData::scanLine(this,local_18);
        in_RDI[local_90] = *(undefined4 *)(puVar5 + (long)local_14 * 4);
        local_7c = iVar3 + local_7c;
        local_80 = iVar4 + local_80;
      }
    }
  }
  else {
    dVar1 = *(double *)(in_RSI + 0x48);
    dVar6 = *(double *)(in_RSI + 0x60) * dVar7 + *(double *)(in_RSI + 0x48) * dVar6 +
            *(double *)(in_RSI + 0x68);
    puVar8 = in_RDI + in_R8D;
    for (; in_RDI < puVar8; in_RDI = in_RDI + 1) {
      local_1c = qFloor<double>(5.85958348101633e-317);
      local_20 = qFloor<double>(5.85959237419795e-317);
      fetchTransformed_pixelBounds<(TextureBlendType)3>
                (*(int *)(in_RSI + 0xb4),*(int *)(in_RSI + 0xbc),*(int *)(in_RSI + 0xc4) + -1,
                 &local_20);
      fetchTransformed_pixelBounds<(TextureBlendType)3>
                (*(int *)(in_RSI + 0xb0),*(int *)(in_RSI + 0xb8),*(int *)(in_RSI + 0xc0) + -1,
                 &local_1c);
      puVar5 = QTextureData::scanLine(this,local_20);
      *in_RDI = *(undefined4 *)(puVar5 + (long)local_1c * 4);
      dVar6 = dVar1 + dVar6;
      if ((dVar6 == 0.0) && (!NAN(dVar6))) {
        dVar6 = dVar1 + dVar6;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}